

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

bool __thiscall QGraphicsItem::isUnderMouse(QGraphicsItem *this)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  QWidget *this_00;
  QGraphicsView **ppQVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QPointF QVar8;
  QPoint local_80;
  QPointF local_78;
  qreal local_68;
  qreal local_60;
  QList<QGraphicsView_*> local_58;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d_ptr).d;
  if (pQVar2->scene == (QGraphicsScene *)0x0) {
    cVar4 = '\0';
  }
  else {
    local_40 = (QPoint)QCursor::pos();
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsScene::views(&local_58,(QGraphicsScene *)pQVar2->scene);
    ppQVar3 = local_58.d.ptr;
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
      cVar4 = '\0';
    }
    else {
      lVar1 = local_58.d.size * 8;
      lVar6 = 0;
      do {
        this_00 = *(QWidget **)((long)ppQVar3 + lVar6);
        local_80 = QWidget::mapFromGlobal(this_00,&local_40);
        QVar8 = QGraphicsView::mapToScene((QGraphicsView *)this_00,&local_80);
        local_78.yp = QVar8.yp;
        local_78.xp = QVar8.xp;
        QVar8 = mapFromScene(this,&local_78);
        local_60 = QVar8.yp;
        local_68 = QVar8.xp;
        iVar5 = (*this->_vptr_QGraphicsItem[5])(this,&local_68);
        cVar4 = (char)iVar5;
        if (cVar4 != '\0') break;
        bVar7 = lVar1 + -8 != lVar6;
        lVar6 = lVar6 + 8;
      } while (bVar7);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar4;
}

Assistant:

bool QGraphicsItem::isUnderMouse() const
{
    Q_D(const QGraphicsItem);
    if (!d->scene)
        return false;

    QPoint cursorPos = QCursor::pos();
    const auto views = d->scene->views();
    for (QGraphicsView *view : views) {
        if (contains(mapFromScene(view->mapToScene(view->mapFromGlobal(cursorPos)))))
            return true;
    }
    return false;
}